

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llhttp.c
# Opt level: O0

llparse_match_t
llparse__match_sequence_id(llhttp__internal_t *s,uchar *p,uchar *endp,uchar *seq,uint32_t seq_len)

{
  llparse_match_t lVar1;
  uchar current;
  uint32_t index;
  uint32_t seq_len_local;
  uchar *seq_local;
  uchar *endp_local;
  uchar *p_local;
  llhttp__internal_t *s_local;
  llparse_match_t res;
  
  index = s->_index;
  p_local = p;
  do {
    if (p_local == endp) {
      s->_index = index;
      res.status = kMatchPause;
LAB_0011672e:
      lVar1._4_4_ = 0;
      lVar1.status = res.status;
      lVar1.current = p_local;
      return lVar1;
    }
    if (*p_local != seq[index]) {
      res.status = kMatchMismatch;
LAB_00116719:
      s->_index = 0;
      goto LAB_0011672e;
    }
    index = index + 1;
    if (index == seq_len) {
      res.status = kMatchComplete;
      goto LAB_00116719;
    }
    p_local = p_local + 1;
  } while( true );
}

Assistant:

static llparse_match_t llparse__match_sequence_id(
    llhttp__internal_t* s, const unsigned char* p,
    const unsigned char* endp,
    const unsigned char* seq, uint32_t seq_len) {
  uint32_t index;
  llparse_match_t res;

  index = s->_index;
  for (; p != endp; p++) {
    unsigned char current;

    current = *p;
    if (current == seq[index]) {
      if (++index == seq_len) {
        res.status = kMatchComplete;
        goto reset;
      }
    } else {
      res.status = kMatchMismatch;
      goto reset;
    }
  }
  s->_index = index;
  res.status = kMatchPause;
  res.current = p;
  return res;
reset:
  s->_index = 0;
  res.current = p;
  return res;
}